

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_memfill16(quint16 *dest,quint16 value,qsizetype count)

{
  if (((ulong)dest & 3) != 0) {
    *dest = value;
    dest = dest + 1;
    count = count - 1;
  }
  if ((count & 1U) != 0) {
    *(quint16 *)((long)dest + (count - 1U) * 2) = value;
  }
  (*qt_memfill32)((quint32 *)dest,(uint)value * 0x10001,count / 2);
  return;
}

Assistant:

void qt_memfill16(quint16 *dest, quint16 value, qsizetype count)
{
    const int align = quintptr(dest) & 0x3;
    if (align) {
        *dest++ = value;
        --count;
    }

    if (count & 0x1)
        dest[count - 1] = value;

    const quint32 value32 = (value << 16) | value;
    qt_memfill32(reinterpret_cast<quint32*>(dest), value32, count / 2);
}